

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NtpClient.h
# Opt level: O2

void __thiscall NtpClient::readPendingDatagrams(NtpClient *this)

{
  char cVar1;
  ulong uVar2;
  long lVar3;
  NtpPacketFlags *pNVar4;
  NtpReply *pNVar5;
  byte bVar6;
  quint16 port;
  QDateTime local_128 [8];
  QHostAddress address;
  NtpFullPacket packet;
  NtpReply local_c8;
  NtpPacketFlags local_78 [72];
  
  bVar6 = 0;
  while( true ) {
    lVar3 = 0x44;
    cVar1 = QUdpSocket::hasPendingDatagrams();
    if (cVar1 == '\0') break;
    packet.auth.keyId = 0;
    packet.auth.messageDigest[0] = '\0';
    packet.auth.messageDigest[1] = '\0';
    packet.auth.messageDigest[2] = '\0';
    packet.auth.messageDigest[3] = '\0';
    packet.auth.messageDigest[4] = '\0';
    packet.auth.messageDigest[5] = '\0';
    packet.auth.messageDigest[6] = '\0';
    packet.auth.messageDigest[7] = '\0';
    packet.auth.messageDigest[8] = '\0';
    packet.auth.messageDigest[9] = '\0';
    packet.auth.messageDigest[10] = '\0';
    packet.auth.messageDigest[0xb] = '\0';
    packet.basic.receiveTimestamp.seconds = 0;
    packet.basic.receiveTimestamp.fraction = 0;
    packet.basic.transmitTimestamp.seconds = 0;
    packet.basic.transmitTimestamp.fraction = 0;
    packet.basic.referenceTimestamp.seconds = 0;
    packet.basic.referenceTimestamp.fraction = 0;
    packet.basic.originateTimestamp.seconds = 0;
    packet.basic.originateTimestamp.fraction = 0;
    packet.basic.flags = (NtpPacketFlags)0x0;
    packet.basic.stratum = '\0';
    packet.basic.poll = '\0';
    packet.basic.precision = '\0';
    packet.basic.rootDelay = 0;
    packet.basic.rootDispersion = 0;
    packet.basic.referenceID[0] = '\0';
    packet.basic.referenceID[1] = '\0';
    packet.basic.referenceID[2] = '\0';
    packet.basic.referenceID[3] = '\0';
    packet.auth.messageDigest[0xc] = '\0';
    packet.auth.messageDigest[0xd] = '\0';
    packet.auth.messageDigest[0xe] = '\0';
    packet.auth.messageDigest[0xf] = '\0';
    QHostAddress::QHostAddress(&address);
    uVar2 = QUdpSocket::readDatagram
                      ((char *)(this->m_socket)._M_t.
                               super___uniq_ptr_impl<QUdpSocket,_std::default_delete<QUdpSocket>_>.
                               _M_t.
                               super__Tuple_impl<0UL,_QUdpSocket_*,_std::default_delete<QUdpSocket>_>
                               .super__Head_base<0UL,_QUdpSocket_*,_false>._M_head_impl,
                       (longlong)&packet,(QHostAddress *)0x44,(ushort *)&address);
    if (0x2f < uVar2) {
      memcpy(local_78,&packet,0x44);
      QDateTime::currentDateTime();
      pNVar4 = local_78;
      pNVar5 = &local_c8;
      for (; lVar3 != 0; lVar3 = lVar3 + -1) {
        (pNVar5->m_packet).basic.flags = *pNVar4;
        pNVar4 = pNVar4 + (ulong)bVar6 * -2 + 1;
        pNVar5 = (NtpReply *)((long)pNVar5 + (ulong)bVar6 * -2 + 1);
      }
      QDateTime::QDateTime(&local_c8.m_destinationTime,local_128);
      replyReceived(this,&address,port,&local_c8);
      QDateTime::~QDateTime(&local_c8.m_destinationTime);
      QDateTime::~QDateTime(local_128);
    }
    QHostAddress::~QHostAddress(&address);
  }
  return;
}

Assistant:

void readPendingDatagrams() {
        while (m_socket->hasPendingDatagrams()) {
            NtpFullPacket packet;
            memset(&packet, 0, sizeof(packet));

            QHostAddress address;
            quint16 port;
            if (m_socket->readDatagram(reinterpret_cast<char *>(&packet), sizeof(packet), &address, &port) < sizeof(NtpPacket))
                continue;

            Q_EMIT replyReceived(address, port, NtpReply(packet, QDateTime::currentDateTime()));
        }
    }